

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalNestedLoopJoinState::PhysicalNestedLoopJoinState
          (PhysicalNestedLoopJoinState *this,ClientContext *context,PhysicalNestedLoopJoin *op,
          vector<duckdb::JoinCondition,_true> *conditions)

{
  pointer pJVar1;
  bool enabled_p;
  type expr;
  pointer pEVar2;
  Allocator *allocator;
  const_reference pvVar3;
  JoinCondition *cond;
  pointer this_00;
  vector<duckdb::LogicalType,_true> condition_types;
  
  (this->super_CachingOperatorState).cached_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__PhysicalNestedLoopJoinState_017a2ce0;
  (this->super_CachingOperatorState).initialized = false;
  (this->super_CachingOperatorState).can_cache_chunk = false;
  *(undefined2 *)&(this->super_CachingOperatorState).field_0x12 = 1;
  DataChunk::DataChunk(&this->left_condition);
  ExpressionExecutor::ExpressionExecutor(&this->lhs_executor,context);
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_buckets =
       &(this->condition_scan_state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->condition_scan_state).current_chunk_state.handles._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->condition_scan_state).current_chunk_state.properties = INVALID;
  (this->condition_scan_state).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->condition_scan_state).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->condition_scan_state).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_buckets =
       &(this->payload_scan_state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->payload_scan_state).current_chunk_state.handles._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->payload_scan_state).current_chunk_state.properties = INVALID;
  (this->payload_scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->payload_scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->payload_scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataChunk::DataChunk(&this->right_condition);
  DataChunk::DataChunk(&this->right_payload);
  this->left_tuple = 0;
  this->right_tuple = 0;
  enabled_p = IsLeftOuterJoin((op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.field_0x81);
  OuterJoinMarker::OuterJoinMarker(&this->left_outer,enabled_p);
  condition_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  condition_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  condition_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pJVar1 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (conditions->
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pJVar1; this_00 = this_00 + 1)
  {
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&this_00->left);
    ExpressionExecutor::AddExpression(&this->lhs_executor,expr);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_00->left);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&condition_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar2->return_type);
  }
  allocator = Allocator::Get(context);
  DataChunk::Initialize(&this->left_condition,allocator,&condition_types,0x800);
  DataChunk::Initialize(&this->right_condition,allocator,&condition_types,0x800);
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.children,1);
  DataChunk::Initialize(&this->right_payload,allocator,&pvVar3->_M_data->types,0x800);
  OuterJoinMarker::Initialize(&this->left_outer,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&condition_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

PhysicalNestedLoopJoinState(ClientContext &context, const PhysicalNestedLoopJoin &op,
	                            const vector<JoinCondition> &conditions)
	    : fetch_next_left(true), fetch_next_right(false), lhs_executor(context), left_tuple(0), right_tuple(0),
	      left_outer(IsLeftOuterJoin(op.join_type)) {
		vector<LogicalType> condition_types;
		for (auto &cond : conditions) {
			lhs_executor.AddExpression(*cond.left);
			condition_types.push_back(cond.left->return_type);
		}
		auto &allocator = Allocator::Get(context);
		left_condition.Initialize(allocator, condition_types);
		right_condition.Initialize(allocator, condition_types);
		right_payload.Initialize(allocator, op.children[1].get().GetTypes());
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
	}